

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void qt_to_latin1_internal<true>(uchar *dst,char16_t *src,qsizetype length)

{
  anon_class_16_2_441918a8_for_code code;
  ulong in_RDX;
  longlong extraout_RDX;
  longlong lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  __m128i chunk;
  __m128i chunk_00;
  __m128i chunk_01;
  __m128i alVar2;
  __m128i result2_1;
  __m128i result1_1;
  __m128i chunk2_1;
  __m128i chunk1_1;
  __m128i result2;
  __m128i result1;
  __m128i chunk2;
  __m128i chunk1;
  __m128i last2;
  __m128i last1;
  qptrdiff offset;
  __m128i outOfRange;
  __m128i questionMark;
  int outOfRange256;
  int questionMark256;
  size_t size_1;
  size_t size;
  anon_class_48_2_02d92d04 loadChunkAt;
  anon_class_32_2_057dd6e7_for_mergeQuestionMarks mergeQuestionMarks;
  longlong in_stack_fffffffffffffc28;
  uchar *in_stack_fffffffffffffc40;
  char16_t *in_stack_fffffffffffffc48;
  qptrdiff in_stack_fffffffffffffc50;
  anon_class_32_2_057dd6e7_for_mergeQuestionMarks *this;
  anon_class_48_2_02d92d04 *in_stack_fffffffffffffc58;
  undefined4 local_368;
  undefined4 local_358;
  undefined8 local_328;
  undefined8 local_318;
  long local_2c0;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  undefined1 local_68 [16];
  longlong local_58;
  longlong local_50;
  longlong local_48;
  longlong local_40;
  anon_class_32_2_057dd6e7_for_mergeQuestionMarks local_38;
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qt_to_latin1_internal<true>::anon_class_1_0_00000001::operator()(&local_11);
  qt_to_latin1_internal<true>::anon_class_1_0_00000001::operator()(&local_12);
  local_38.questionMark[0] = 0x3f003f003f003f;
  local_38.questionMark[1] = 0x3f003f003f003f;
  local_38.outOfRange[0] = 0x100010001000100;
  local_38.outOfRange[1] = 0x100010001000100;
  lVar1 = 0xaa;
  memset(local_68,0xaa,0x30);
  local_58 = local_38.questionMark[0];
  local_50 = local_38.questionMark[1];
  local_48 = local_38.outOfRange[0];
  local_40 = local_38.outOfRange[1];
  if (in_RDX < 0x10) {
    if ((long)in_RDX < 4) {
      code.src = in_stack_fffffffffffffc48;
      code.dst = in_stack_fffffffffffffc40;
      (anonymous_namespace)::UnrollTailLoop<3u>::
      exec<qt_to_latin1_internal<true>(unsigned_char*,char16_t_const*,long_long)::_lambda(long_long)_2_,long_long>
                (in_stack_fffffffffffffc28,code);
    }
    else if ((long)in_RDX < 8) {
      alVar2[1] = extraout_RDX;
      alVar2[0] = lVar1;
      alVar2 = qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::
               anon_class_32_2_057dd6e7_for_mergeQuestionMarks::operator()(&local_38,alVar2);
      chunk_01[1] = alVar2[1];
      chunk_01[0] = lVar1;
      qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::
      anon_class_32_2_057dd6e7_for_mergeQuestionMarks::operator()(&local_38,chunk_01);
      local_158 = (short)extraout_XMM0_Qa_04;
      sStack_156 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x10);
      sStack_154 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x20);
      sStack_152 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x30);
      local_358 = CONCAT13((0 < sStack_152) * (sStack_152 < 0x100) *
                           (char)((ulong)extraout_XMM0_Qa_04 >> 0x30) - (0xff < sStack_152),
                           CONCAT12((0 < sStack_154) * (sStack_154 < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qa_04 >> 0x20) - (0xff < sStack_154)
                                    ,CONCAT11((0 < sStack_156) * (sStack_156 < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qa_04 >> 0x10) -
                                              (0xff < sStack_156),
                                              (0 < local_158) * (local_158 < 0x100) *
                                              (char)extraout_XMM0_Qa_04 - (0xff < local_158))));
      local_178 = (short)extraout_XMM0_Qa_05;
      sStack_176 = (short)((ulong)extraout_XMM0_Qa_05 >> 0x10);
      sStack_174 = (short)((ulong)extraout_XMM0_Qa_05 >> 0x20);
      sStack_172 = (short)((ulong)extraout_XMM0_Qa_05 >> 0x30);
      local_368 = CONCAT13((0 < sStack_172) * (sStack_172 < 0x100) *
                           (char)((ulong)extraout_XMM0_Qa_05 >> 0x30) - (0xff < sStack_172),
                           CONCAT12((0 < sStack_174) * (sStack_174 < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qa_05 >> 0x20) - (0xff < sStack_174)
                                    ,CONCAT11((0 < sStack_176) * (sStack_176 < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qa_05 >> 0x10) -
                                              (0xff < sStack_176),
                                              (0 < local_178) * (local_178 < 0x100) *
                                              (char)extraout_XMM0_Qa_05 - (0xff < local_178))));
      local_c = local_358;
      *(undefined4 *)in_RDI = local_358;
      local_10 = local_368;
      *(undefined4 *)((long)in_RDI + (in_RDX - 4)) = local_368;
    }
    else {
      this = &local_38;
      chunk[1] = extraout_RDX;
      chunk[0] = lVar1;
      alVar2 = qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::
               anon_class_32_2_057dd6e7_for_mergeQuestionMarks::operator()(this,chunk);
      chunk_00[1] = alVar2[1];
      chunk_00[0] = lVar1;
      qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::
      anon_class_32_2_057dd6e7_for_mergeQuestionMarks::operator()(this,chunk_00);
      local_118 = (short)extraout_XMM0_Qa_02;
      sStack_116 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
      sStack_114 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
      sStack_112 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
      sStack_110 = (short)extraout_XMM0_Qb_02;
      sStack_10e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
      sStack_10c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      sStack_10a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
      local_318 = CONCAT17((0 < sStack_10a) * (sStack_10a < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_10a),
                           CONCAT16((0 < sStack_10c) * (sStack_10c < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_10c)
                                    ,CONCAT15((0 < sStack_10e) * (sStack_10e < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) -
                                              (0xff < sStack_10e),
                                              CONCAT14((0 < sStack_110) * (sStack_110 < 0x100) *
                                                       (char)extraout_XMM0_Qb_02 -
                                                       (0xff < sStack_110),
                                                       CONCAT13((0 < sStack_112) *
                                                                (sStack_112 < 0x100) *
                                                                (char)((ulong)extraout_XMM0_Qa_02 >>
                                                                      0x30) - (0xff < sStack_112),
                                                                CONCAT12((0 < sStack_114) *
                                                                         (sStack_114 < 0x100) *
                                                                         (char)((ulong)
                                                  extraout_XMM0_Qa_02 >> 0x20) - (0xff < sStack_114)
                                                  ,CONCAT11((0 < sStack_116) * (sStack_116 < 0x100)
                                                            * (char)((ulong)extraout_XMM0_Qa_02 >>
                                                                    0x10) - (0xff < sStack_116),
                                                            (0 < local_118) * (local_118 < 0x100) *
                                                            (char)extraout_XMM0_Qa_02 -
                                                            (0xff < local_118))))))));
      local_138 = (short)extraout_XMM0_Qa_03;
      sStack_136 = (short)((ulong)extraout_XMM0_Qa_03 >> 0x10);
      sStack_134 = (short)((ulong)extraout_XMM0_Qa_03 >> 0x20);
      sStack_132 = (short)((ulong)extraout_XMM0_Qa_03 >> 0x30);
      sStack_130 = (short)extraout_XMM0_Qb_03;
      sStack_12e = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
      sStack_12c = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
      sStack_12a = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
      local_328 = CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_03 >> 0x30) - (0xff < sStack_12a),
                           CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_03 >> 0x20) - (0xff < sStack_12c)
                                    ,CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) *
                                              (char)((ulong)extraout_XMM0_Qb_03 >> 0x10) -
                                              (0xff < sStack_12e),
                                              CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                                       (char)extraout_XMM0_Qb_03 -
                                                       (0xff < sStack_130),
                                                       CONCAT13((0 < sStack_132) *
                                                                (sStack_132 < 0x100) *
                                                                (char)((ulong)extraout_XMM0_Qa_03 >>
                                                                      0x30) - (0xff < sStack_132),
                                                                CONCAT12((0 < sStack_134) *
                                                                         (sStack_134 < 0x100) *
                                                                         (char)((ulong)
                                                  extraout_XMM0_Qa_03 >> 0x20) - (0xff < sStack_134)
                                                  ,CONCAT11((0 < sStack_136) * (sStack_136 < 0x100)
                                                            * (char)((ulong)extraout_XMM0_Qa_03 >>
                                                                    0x10) - (0xff < sStack_136),
                                                            (0 < local_138) * (local_138 < 0x100) *
                                                            (char)extraout_XMM0_Qa_03 -
                                                            (0xff < local_138))))))));
      *in_RDI = local_318;
      *(undefined8 *)((long)in_RDI + (in_RDX - 8)) = local_328;
    }
  }
  else {
    for (local_2c0 = 0; local_2c0 + 0x20U < in_RDX; local_2c0 = local_2c0 + 0x10) {
      qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::operator()
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      *(undefined8 *)((long)in_RDI + local_2c0) = extraout_XMM0_Qa;
      ((undefined8 *)((long)in_RDI + local_2c0))[1] = extraout_XMM0_Qb;
    }
    qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::operator()
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    qt_to_latin1_internal<true>::anon_class_48_2_02d92d04::operator()
              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    *(undefined8 *)((long)in_RDI + local_2c0) = extraout_XMM0_Qa_00;
    ((undefined8 *)((long)in_RDI + local_2c0))[1] = extraout_XMM0_Qb_00;
    *(undefined8 *)((long)in_RDI + (in_RDX - 0x10)) = extraout_XMM0_Qa_01;
    *(undefined8 *)((long)in_RDI + (in_RDX - 8)) = extraout_XMM0_Qb_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_to_latin1_internal(uchar *dst, const char16_t *src, qsizetype length)
{
#if defined(__SSE2__)
    auto questionMark256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128('?'));
        else
            return 0;
    }();
    auto outOfRange256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128(0x100));
        else
            return 0;
    }();
    __m128i questionMark, outOfRange;
    if constexpr (UseAvx2) {
        questionMark = _mm256_castsi256_si128(questionMark256);
        outOfRange = _mm256_castsi256_si128(outOfRange256);
    } else {
        questionMark = _mm_set1_epi16('?');
        outOfRange = _mm_set1_epi16(0x100);
    }

    auto mergeQuestionMarks = [=](__m128i chunk) {
        if (!Checked)
            return chunk;

        // SSE has no compare instruction for unsigned comparison.
        if constexpr (UseSse4_1) {
            // We use an unsigned uc = qMin(uc, 0x100) and then compare for equality.
            chunk = _mm_min_epu16(chunk, outOfRange);
            const __m128i offLimitMask = _mm_cmpeq_epi16(chunk, outOfRange);
            chunk = _mm_blendv_epi8(chunk, questionMark, offLimitMask);
            return chunk;
        }
        // The variables must be shiffted + 0x8000 to be compared
        const __m128i signedBitOffset = _mm_set1_epi16(short(0x8000));
        const __m128i thresholdMask = _mm_set1_epi16(short(0xff + 0x8000));

        const __m128i signedChunk = _mm_add_epi16(chunk, signedBitOffset);
        const __m128i offLimitMask = _mm_cmpgt_epi16(signedChunk, thresholdMask);

        // offLimitQuestionMark contains '?' for each 16 bits that was off-limit
        // the 16 bits that were correct contains zeros
        const __m128i offLimitQuestionMark = _mm_and_si128(offLimitMask, questionMark);

        // correctBytes contains the bytes that were in limit
        // the 16 bits that were off limits contains zeros
        const __m128i correctBytes = _mm_andnot_si128(offLimitMask, chunk);

        // merge offLimitQuestionMark and correctBytes to have the result
        chunk = _mm_or_si128(correctBytes, offLimitQuestionMark);

        Q_UNUSED(outOfRange);
        return chunk;
    };

    // we're going to read to src[offset..offset+15] (16 bytes)
    auto loadChunkAt = [=](qptrdiff offset) {
        __m128i chunk1, chunk2;
        if constexpr (UseAvx2) {
            __m256i chunk = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(src + offset));
            if (Checked) {
                // See mergeQuestionMarks lambda above for details
                chunk = _mm256_min_epu16(chunk, outOfRange256);
                const __m256i offLimitMask = _mm256_cmpeq_epi16(chunk, outOfRange256);
                chunk = _mm256_blendv_epi8(chunk, questionMark256, offLimitMask);
            }

            chunk2 = _mm256_extracti128_si256(chunk, 1);
            chunk1 = _mm256_castsi256_si128(chunk);
        } else {
            chunk1 = _mm_loadu_si128((const __m128i*)(src + offset)); // load
            chunk1 = mergeQuestionMarks(chunk1);

            chunk2 = _mm_loadu_si128((const __m128i*)(src + offset + 8)); // load
            chunk2 = mergeQuestionMarks(chunk2);
        }

        // pack the two vector to 16 x 8bits elements
        return _mm_packus_epi16(chunk1, chunk2);
    };

    if (size_t(length) >= sizeof(__m128i)) {
        // because of possible overlapping, we won't process the last chunk in the loop
        qptrdiff offset = 0;
        for ( ; offset + 2 * sizeof(__m128i) < size_t(length); offset += sizeof(__m128i))
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), loadChunkAt(offset));

        // overlapped conversion of the last full chunk and the tail
        __m128i last1 = loadChunkAt(offset);
        __m128i last2 = loadChunkAt(length - sizeof(__m128i));
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), last1);
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + length - sizeof(__m128i)), last2);
        return;
    }

#  if !defined(__OPTIMIZE_SIZE__)
    if (length >= 4) {
        // this code is fine even for in-place conversion because we load both
        // before any store
        if (length >= 8) {
            __m128i chunk1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src + length - 8));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, where the upper half is ignored
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst), result1);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst + length - 8), result2);
        } else {
            __m128i chunk1 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src + length - 4));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, we'll zero the upper three quarters
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            qToUnaligned(_mm_cvtsi128_si32(result1), dst);
            qToUnaligned(_mm_cvtsi128_si32(result2), dst + length - 4);
        }
        return;
    }

    length = length % 4;
    return UnrollTailLoop<3>::exec(length, [=](qsizetype i) {
        if (Checked)
            dst[i] = (src[i]>0xff) ? '?' : (uchar) src[i];
        else
            dst[i] = src[i];
    });
#  else
    length = length % 16;
#  endif // optimize size
#elif defined(__ARM_NEON__)
    // Refer to the documentation of the SSE2 implementation.
    // This uses exactly the same method as for SSE except:
    // 1) neon has unsigned comparison
    // 2) packing is done to 64 bits (8 x 8bits component).
    if (length >= 16) {
        const qsizetype chunkCount = length >> 3; // divided by 8
        const uint16x8_t questionMark = vdupq_n_u16('?'); // set
        const uint16x8_t thresholdMask = vdupq_n_u16(0xff); // set
        for (qsizetype i = 0; i < chunkCount; ++i) {
            uint16x8_t chunk = vld1q_u16((uint16_t *)src); // load
            src += 8;

            if (Checked) {
                const uint16x8_t offLimitMask = vcgtq_u16(chunk, thresholdMask); // chunk > thresholdMask
                const uint16x8_t offLimitQuestionMark = vandq_u16(offLimitMask, questionMark); // offLimitMask & questionMark
                const uint16x8_t correctBytes = vbicq_u16(chunk, offLimitMask); // !offLimitMask & chunk
                chunk = vorrq_u16(correctBytes, offLimitQuestionMark); // correctBytes | offLimitQuestionMark
            }
            const uint8x8_t result = vmovn_u16(chunk); // narrowing move->packing
            vst1_u8(dst, result); // store
            dst += 8;
        }
        length = length % 8;
    }
#endif
#if defined(__mips_dsp)
    static_assert(sizeof(qsizetype) == sizeof(int),
                  "oops, the assembler implementation needs to be called in a loop");
    qt_toLatin1_mips_dsp_asm(dst, src, length);
#else
    while (length--) {
        if (Checked)
            *dst++ = (*src>0xff) ? '?' : (uchar) *src;
        else
            *dst++ = *src;
        ++src;
    }
#endif
}